

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::UdpBodySyntax::UdpBodySyntax
          (UdpBodySyntax *this,SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *portDecls,
          UdpInitialStmtSyntax *initialStmt,Token table,
          SyntaxList<slang::syntax::UdpEntrySyntax> *entries,Token endtable)

{
  size_t sVar1;
  pointer ppUVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  UdpPortDeclSyntax *pUVar5;
  undefined8 uVar6;
  long lVar7;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *__range2;
  iterator_base<slang::syntax::UdpPortDeclSyntax_*> local_30;
  
  uVar6 = table._0_8_;
  (this->super_SyntaxNode).kind = UdpBody;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(portDecls->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (portDecls->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->portDecls).super_SyntaxListBase.super_SyntaxNode.kind =
       (portDecls->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->portDecls).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->portDecls).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->portDecls).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (portDecls->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->portDecls).super_SyntaxListBase.childCount = (portDecls->super_SyntaxListBase).childCount;
  (this->portDecls).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e8ea0
  ;
  sVar1 = (portDecls->elements)._M_extent._M_extent_value;
  (this->portDecls).elements._M_ptr = (portDecls->elements)._M_ptr;
  (this->portDecls).elements._M_extent._M_extent_value = sVar1;
  this->initialStmt = initialStmt;
  (this->table).kind = (short)uVar6;
  (this->table).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->table).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->table).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->table).info = table.info;
  uVar4 = *(undefined4 *)&(entries->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (entries->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->entries).super_SyntaxListBase.super_SyntaxNode.kind =
       (entries->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->entries).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->entries).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->entries).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (entries->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->entries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e7db0;
  (this->entries).super_SyntaxListBase.childCount = (entries->super_SyntaxListBase).childCount;
  sVar1 = (entries->super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_ptr =
       (entries->super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->entries).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e8f80;
  (this->endtable).kind = endtable.kind;
  (this->endtable).field_0x2 = endtable._2_1_;
  (this->endtable).numFlags = (NumericTokenFlags)endtable.numFlags.raw;
  (this->endtable).rawLen = endtable.rawLen;
  (this->endtable).info = endtable.info;
  (this->portDecls).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->portDecls).elements._M_extent._M_extent_value;
  local_30.list = &this->portDecls;
  for (; (local_30.list != &this->portDecls || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pUVar5 = SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::
             iterator_base<slang::syntax::UdpPortDeclSyntax_*>::dereference(&local_30);
    (pUVar5->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  if (this->initialStmt != (UdpInitialStmtSyntax *)0x0) {
    (this->initialStmt->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  (this->entries).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  ppUVar2 = (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
            _M_ptr;
  sVar1 = (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar7 = 0; sVar1 << 3 != lVar7; lVar7 = lVar7 + 8) {
    *(UdpBodySyntax **)(*(long *)((long)ppUVar2 + lVar7) + 8) = this;
  }
  return;
}

Assistant:

UdpBodySyntax(const SeparatedSyntaxList<UdpPortDeclSyntax>& portDecls, UdpInitialStmtSyntax* initialStmt, Token table, const SyntaxList<UdpEntrySyntax>& entries, Token endtable) :
        SyntaxNode(SyntaxKind::UdpBody), portDecls(portDecls), initialStmt(initialStmt), table(table), entries(entries), endtable(endtable) {
        this->portDecls.parent = this;
        for (auto child : this->portDecls)
            child->parent = this;
        if (this->initialStmt) this->initialStmt->parent = this;
        this->entries.parent = this;
        for (auto child : this->entries)
            child->parent = this;
    }